

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

int Curl_hash_delete(Curl_hash *h,void *key,size_t key_len)

{
  Curl_llist *pCVar1;
  size_t sVar2;
  Curl_llist_node *n;
  void *pvVar3;
  
  pCVar1 = h->table;
  if (pCVar1 != (Curl_llist *)0x0) {
    sVar2 = (*h->hash_func)(key,key_len,h->slots);
    for (n = Curl_llist_head(pCVar1 + sVar2); n != (Curl_llist_node *)0x0; n = Curl_node_next(n)) {
      pvVar3 = Curl_node_elem(n);
      sVar2 = (*h->comp_func)((void *)((long)pvVar3 + 0x38),*(size_t *)((long)pvVar3 + 0x30),key,
                              key_len);
      if (sVar2 != 0) {
        Curl_node_uremove(n,h);
        h->size = h->size - 1;
        if (n == (Curl_llist_node *)0x0) {
          return 1;
        }
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int Curl_hash_delete(struct Curl_hash *h, void *key, size_t key_len)
{
  DEBUGASSERT(h);
  DEBUGASSERT(h->slots);
  DEBUGASSERT(h->init == HASHINIT);
  if(h->table) {
    struct Curl_llist_node *le;
    struct Curl_llist *l = FETCH_LIST(h, key, key_len);

    for(le = Curl_llist_head(l); le; le = Curl_node_next(le)) {
      struct Curl_hash_element *he = Curl_node_elem(le);
      if(h->comp_func(he->key, he->key_len, key, key_len)) {
        Curl_node_uremove(le, (void *) h);
        --h->size;
        return 0;
      }
    }
  }
  return 1;
}